

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

Result * __thiscall
CoreML::
validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,int maxFeatureCount,
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          *allowedFeatureTypes)

{
  bool bVar1;
  Type *featureDesc;
  undefined4 in_register_0000000c;
  int i;
  int iVar2;
  undefined1 local_a0 [40];
  Result result;
  string local_50;
  
  Result::Result(&result);
  iVar2 = (int)features;
  if ((iVar2 == 0) || (*(int *)(this + 8) <= iVar2)) {
    iVar2 = 0;
    do {
      if (*(int *)(this + 8) <= iVar2) break;
      featureDesc = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              ((RepeatedPtrFieldBase *)this,iVar2);
      validateSchemaTypes((Result *)local_a0,
                          (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           *)CONCAT44(in_register_0000000c,maxFeatureCount),featureDesc);
      Result::operator=(&result,(Result *)local_a0);
      std::__cxx11::string::~string((string *)(local_a0 + 8));
      bVar1 = Result::good(&result);
      iVar2 = iVar2 + 1;
    } while (bVar1);
    Result::Result(__return_storage_ptr__,&result);
  }
  else {
    std::__cxx11::to_string(&local_50,iVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "Feature descriptions exceeded ",&local_50);
    Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateDescriptionsContainFeatureWithTypes(const Descriptions &features,
                                                              int maxFeatureCount,
                                                              const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes) {
        Result result;
        
        // 0 means no maximum fixed feature count.
        if (maxFeatureCount != 0 && features.size() > maxFeatureCount) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE, "Feature descriptions exceeded " + std::to_string(maxFeatureCount));
        }
        
        for (int i = 0; i < features.size(); i++) {
            result = validateSchemaTypes(allowedFeatureTypes, features[i]);
            if (!result.good()) {
                return result;
            }
        }
        
        return result;
    }